

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.h
# Opt level: O0

int __thiscall axl::io::SimpleMappedFile::close(SimpleMappedFile *this,int __fd)

{
  File::close(&this->m_file,__fd);
  Mapping::close(&this->m_mapping,__fd);
  this->m_openFlags = 0;
  return (int)this;
}

Assistant:

void
	close() {
		m_file.close();
		m_mapping.close();
		m_openFlags = 0;
	}